

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::objectivec::ExtensionGenerator::GenerateMembersHeader
          (ExtensionGenerator *this,Printer *printer)

{
  FieldDescriptor *pFVar1;
  initializer_list<google::protobuf::io::Printer::Sub> v;
  bool bVar2;
  FileDescriptor *file;
  Sub *local_5b0;
  basic_string_view<char,_std::char_traits<char>_> local_538;
  undefined1 local_521;
  string local_520;
  allocator<char> local_4f9;
  string local_4f8;
  string_view local_4d8;
  char *local_4c8;
  allocator<char> local_4b9;
  string local_4b8;
  anon_class_16_2_39a024bb_for_cb local_498;
  allocator<char> local_481;
  string local_480;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_458;
  AnnotationRecord local_450;
  allocator<char> local_3f9;
  string local_3f8;
  Sub local_3d8;
  Sub *local_320;
  Sub local_318;
  Sub local_260;
  Sub local_1a8;
  Sub local_f0;
  iterator local_38;
  size_type local_30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_28;
  undefined1 local_18 [8];
  Printer *printer_local;
  ExtensionGenerator *this_local;
  
  local_521 = 1;
  local_320 = &local_318;
  local_18 = (undefined1  [8])printer;
  printer_local = (Printer *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f8,"method_name",&local_3f9);
  io::Printer::Sub::Sub<std::__cxx11::string_const&>(&local_3d8,&local_3f8,&this->method_name_);
  pFVar1 = this->descriptor_;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_458);
  io::Printer::AnnotationRecord::AnnotationRecord<google::protobuf::FieldDescriptor,_0>
            (&local_450,pFVar1,local_458);
  io::Printer::Sub::AnnotatedAs(&local_318,&local_3d8,&local_450);
  local_320 = &local_260;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_480,"comments",&local_481);
  local_498.printer = (Printer **)local_18;
  local_498.this = this;
  io::Printer::Sub::
  Sub<google::protobuf::compiler::objectivec::ExtensionGenerator::GenerateMembersHeader(google::protobuf::io::Printer*)const::__0>
            (&local_260,&local_480,&local_498);
  local_320 = &local_1a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4b8,"storage_attribute",&local_4b9);
  local_4d8 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view
                        ((string *)&this->method_name_);
  bVar2 = IsRetainedName(local_4d8);
  local_4c8 = "";
  if (bVar2) {
    local_4c8 = "NS_RETURNS_NOT_RETAINED";
  }
  io::Printer::Sub::Sub<char_const*>(&local_1a8,&local_4b8,&local_4c8);
  local_320 = &local_f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4f8,"deprecated_attribute",&local_4f9);
  pFVar1 = this->descriptor_;
  file = FieldDescriptor::file(pFVar1);
  GetOptionalDeprecatedAttribute<google::protobuf::FieldDescriptor>(&local_520,pFVar1,file);
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_f0,&local_4f8,&local_520);
  local_521 = 0;
  local_38 = &local_318;
  local_30 = 4;
  v._M_len = 4;
  v._M_array = local_38;
  absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
  Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
            ((Span<google::protobuf::io::Printer::Sub_const> *)local_28._M_local_buf,v);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_538,
             "\n        $comments$\n        + (GPBExtensionDescriptor *)$method_name$$ storage_attribute$$ deprecated_attribute$;\n      "
            );
  io::Printer::SourceLocation::current();
  io::Printer::Emit(printer,local_28._M_allocated_capacity,local_28._8_8_,local_538._M_len,
                    local_538._M_str);
  local_5b0 = (Sub *)&local_38;
  do {
    local_5b0 = local_5b0 + -1;
    io::Printer::Sub::~Sub(local_5b0);
  } while (local_5b0 != &local_318);
  std::__cxx11::string::~string((string *)&local_520);
  std::__cxx11::string::~string((string *)&local_4f8);
  std::allocator<char>::~allocator(&local_4f9);
  std::__cxx11::string::~string((string *)&local_4b8);
  std::allocator<char>::~allocator(&local_4b9);
  std::__cxx11::string::~string((string *)&local_480);
  std::allocator<char>::~allocator(&local_481);
  io::Printer::AnnotationRecord::~AnnotationRecord(&local_450);
  io::Printer::Sub::~Sub(&local_3d8);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::allocator<char>::~allocator(&local_3f9);
  return;
}

Assistant:

void ExtensionGenerator::GenerateMembersHeader(io::Printer* printer) const {
  printer->Emit(
      {Sub("method_name", method_name_).AnnotatedAs(descriptor_),
       {"comments",
        [&] { EmitCommentsString(printer, generation_options_, descriptor_); }},
       {"storage_attribute",
        IsRetainedName(method_name_) ? "NS_RETURNS_NOT_RETAINED" : ""},
       {"deprecated_attribute",
        // Unlike normal message fields, check if the file for the extension was
        // deprecated.
        GetOptionalDeprecatedAttribute(descriptor_, descriptor_->file())}},
      R"objc(
        $comments$
        + (GPBExtensionDescriptor *)$method_name$$ storage_attribute$$ deprecated_attribute$;
      )objc");
}